

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring64_bitmap_add_range_closed(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  ulong uVar1;
  uint *high48;
  uint16_t min_00;
  ulong uVar2;
  uint8_t min_high48 [6];
  uint8_t current_high48 [6];
  uint8_t max_high48 [6];
  uint local_40;
  undefined2 local_3c;
  uint local_38;
  ushort local_34;
  uint local_30;
  undefined2 local_2c;
  
  if (min <= max) {
    local_40 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    uVar2 = (min & 0xff000000) << 8 | (min & 0xff0000) << 0x18;
    local_30 = (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
               (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
    uVar1 = (max & 0xff000000) << 8 | (max & 0xff0000) << 0x18;
    local_3c = (undefined2)(uVar2 >> 0x20);
    local_2c = (undefined2)(uVar1 >> 0x20);
    min_00 = (uint16_t)min;
    if ((int)(uVar1 >> 0x20) == (int)(uVar2 >> 0x20) && local_30 == local_40) {
      high48 = &local_40;
    }
    else {
      add_range_closed_at(r,&r->art,(uint8_t *)&local_40,min_00,0xffff);
      uVar2 = (min >> 0x10) + 1;
      if (uVar2 < max >> 0x10) {
        do {
          local_38 = ((uint)(uVar2 >> 0x20) & 0xff00) >> 8 | (uint)(uVar2 >> 0x18) & 0xff00 |
                     (uint)(uVar2 >> 8) & 0xff0000 | (uint)(((uVar2 & 0xff0000) << 0x18) >> 0x10);
          local_34 = (ushort)(uVar2 >> 8) & 0xff | (ushort)((uVar2 << 0x38) >> 0x30);
          add_range_closed_at(r,&r->art,(uint8_t *)&local_38,0,0xffff);
          uVar2 = uVar2 + 1;
        } while (max >> 0x10 != uVar2);
      }
      high48 = &local_30;
      min_00 = 0;
    }
    add_range_closed_at(r,&r->art,(uint8_t *)high48,min_00,(uint16_t)max);
  }
  return;
}

Assistant:

void roaring64_bitmap_add_range_closed(roaring64_bitmap_t *r, uint64_t min,
                                       uint64_t max) {
    if (min > max) {
        return;
    }

    art_t *art = &r->art;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);
    if (compare_high48(min_high48, max_high48) == 0) {
        // Only populate range within one container.
        add_range_closed_at(r, art, min_high48, min_low16, max_low16);
        return;
    }

    // Populate a range across containers. Fill intermediate containers
    // entirely.
    add_range_closed_at(r, art, min_high48, min_low16, 0xffff);
    uint64_t min_high_bits = min >> 16;
    uint64_t max_high_bits = max >> 16;
    for (uint64_t current = min_high_bits + 1; current < max_high_bits;
         ++current) {
        uint8_t current_high48[ART_KEY_BYTES];
        split_key(current << 16, current_high48);
        add_range_closed_at(r, art, current_high48, 0, 0xffff);
    }
    add_range_closed_at(r, art, max_high48, 0, max_low16);
}